

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srsw_fifo_unittest.cpp
# Opt level: O0

void __thiscall
SRSWFifoUnitTest_test_size_Test::SRSWFifoUnitTest_test_size_Test
          (SRSWFifoUnitTest_test_size_Test *this)

{
  SRSWFifoUnitTest_test_size_Test *this_local;
  
  SRSWFifoUnitTest::SRSWFifoUnitTest(&this->super_SRSWFifoUnitTest);
  (this->super_SRSWFifoUnitTest).super_Test._vptr_Test =
       (_func_int **)&PTR__SRSWFifoUnitTest_test_size_Test_0018b9b8;
  return;
}

Assistant:

TEST_F(SRSWFifoUnitTest, test_size)
{
    int_fifo f(4);
    EXPECT_EQ(static_cast<size_t>(0u), f.size());
    f.push(10);
    EXPECT_EQ(1u, f.size());
    f.push(20);
    EXPECT_EQ(2u, f.size());
    f.push(30);
    EXPECT_EQ(3u, f.size());
    f.push(40);
    EXPECT_EQ(3u, f.size());
    f.pop();
    EXPECT_EQ(2u, f.size());
    f.push(40);
    EXPECT_EQ(3u, f.size());
    f.pop();
    EXPECT_EQ(2u, f.size());
    f.pop();
    EXPECT_EQ(1u, f.size());
    f.pop();
    EXPECT_EQ(static_cast<size_t>(0u), f.size());
}